

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

optional<unsigned_long> soul::AST::Connection::getEndpointIndex(Expression *e)

{
  _Storage<unsigned_long,_true> _Var1;
  ArrayElementRef *pAVar2;
  Expression *pEVar3;
  Constant *pCVar4;
  undefined8 extraout_RDX;
  undefined8 uVar5;
  optional<unsigned_long> oVar6;
  pool_ptr<soul::AST::Constant> c;
  pool_ptr<soul::AST::ArrayElementRef> sub;
  pool_ptr<soul::AST::Constant> local_58;
  pool_ptr<soul::AST::ArrayElementRef> local_50;
  CompileMessage local_48;
  
  _Var1 = (_Storage<unsigned_long,_true>)
          cast<soul::AST::ArrayElementRef,soul::AST::Expression>((soul *)&local_50,e);
  if (local_50.object == (ArrayElementRef *)0x0) {
    uVar5 = 0;
  }
  else {
    pAVar2 = pool_ptr<soul::AST::ArrayElementRef>::operator->(&local_50);
    if (pAVar2->isSlice == true) {
      throwInternalCompilerError("! sub->isSlice","getEndpointIndex",0x4d0);
    }
    pAVar2 = pool_ptr<soul::AST::ArrayElementRef>::operator->(&local_50);
    pEVar3 = pool_ptr<soul::AST::Expression>::operator->(&pAVar2->startIndex);
    (*(pEVar3->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_58,pEVar3);
    if (local_58.object == (Constant *)0x0) {
      Errors::endpointIndexMustBeConstant<>();
      Context::throwError(&(e->super_Statement).super_ASTObject.context,&local_48,false);
    }
    pCVar4 = pool_ptr<soul::AST::Constant>::operator->(&local_58);
    _Var1._M_value = soul::Value::getAsInt64(&pCVar4->value);
    uVar5 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
  }
  oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar5;
  oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = _Var1._M_value;
  return (optional<unsigned_long>)
         oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

static std::optional<size_t> getEndpointIndex (Expression& e)
        {
            if (auto sub = cast<ArrayElementRef> (e))
            {
                SOUL_ASSERT (! sub->isSlice);

                if (auto c = sub->startIndex->getAsConstant())
                    return c->value.getAsInt64();

                e.context.throwError (Errors::endpointIndexMustBeConstant());
            }

            return {};
        }